

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

void __thiscall
double_conversion::DoubleToStringConverter::CreateDecimalRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int decimal_point,
          int digits_after_point,StringBuilder *result_builder)

{
  int in_ECX;
  int in_EDX;
  uint *in_RDI;
  int in_R8D;
  char *in_R9;
  int remaining_digits_1;
  int remaining_digits;
  char c;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  c = (char)((ulong)in_RDI >> 0x38);
  if (in_ECX < 1) {
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
    if (0 < in_R8D) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
      StringBuilder::AddPadding
                ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                 (char)((ulong)in_R9 >> 0x38),(int)in_R9);
      StringBuilder::AddSubstring
                ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,
                 in_stack_ffffffffffffffd4);
      in_stack_ffffffffffffffd4 = (in_R8D + in_ECX) - in_EDX;
      StringBuilder::AddPadding
                ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                 (char)((ulong)in_R9 >> 0x38),(int)in_R9);
    }
  }
  else if (in_ECX < in_EDX) {
    StringBuilder::AddSubstring
              ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,
               in_stack_ffffffffffffffd4);
    StringBuilder::AddCharacter
              ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
    StringBuilder::AddSubstring
              ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,
               in_stack_ffffffffffffffd4);
    in_stack_ffffffffffffffd0 = in_R8D - (in_EDX - in_ECX);
    StringBuilder::AddPadding
              ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
               (char)((ulong)in_R9 >> 0x38),(int)in_R9);
  }
  else {
    StringBuilder::AddSubstring
              ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,
               in_stack_ffffffffffffffd4);
    StringBuilder::AddPadding
              ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
               (char)((ulong)in_R9 >> 0x38),(int)in_R9);
    if (0 < in_R8D) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
      StringBuilder::AddPadding
                ((StringBuilder *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                 (char)((ulong)in_R9 >> 0x38),(int)in_R9);
    }
  }
  if (in_R8D == 0) {
    if ((*in_RDI & 2) != 0) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
    }
    if ((*in_RDI & 4) != 0) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),c);
    }
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateDecimalRepresentation(
    const char* decimal_digits,
    int length,
    int decimal_point,
    int digits_after_point,
    StringBuilder* result_builder) const {
  // Create a representation that is padded with zeros if needed.
  if (decimal_point <= 0) {
      // "0.00000decimal_rep" or "0.000decimal_rep00".
    result_builder->AddCharacter('0');
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', -decimal_point);
      DOUBLE_CONVERSION_ASSERT(length <= digits_after_point - (-decimal_point));
      result_builder->AddSubstring(decimal_digits, length);
      int remaining_digits = digits_after_point - (-decimal_point) - length;
      result_builder->AddPadding('0', remaining_digits);
    }
  } else if (decimal_point >= length) {
    // "decimal_rep0000.00000" or "decimal_rep.0000".
    result_builder->AddSubstring(decimal_digits, length);
    result_builder->AddPadding('0', decimal_point - length);
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', digits_after_point);
    }
  } else {
    // "decima.l_rep000".
    DOUBLE_CONVERSION_ASSERT(digits_after_point > 0);
    result_builder->AddSubstring(decimal_digits, decimal_point);
    result_builder->AddCharacter('.');
    DOUBLE_CONVERSION_ASSERT(length - decimal_point <= digits_after_point);
    result_builder->AddSubstring(&decimal_digits[decimal_point],
                                 length - decimal_point);
    int remaining_digits = digits_after_point - (length - decimal_point);
    result_builder->AddPadding('0', remaining_digits);
  }
  if (digits_after_point == 0) {
    if ((flags_ & EMIT_TRAILING_DECIMAL_POINT) != 0) {
      result_builder->AddCharacter('.');
    }
    if ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) {
      result_builder->AddCharacter('0');
    }
  }
}